

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O2

string * __thiscall Connection::readLine_abi_cxx11_(string *__return_storage_ptr__,Connection *this)

{
  undefined8 in_RAX;
  undefined8 uStack_28;
  char ch;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uStack_28 = in_RAX;
  while( true ) {
    recv(this->sock,&ch,1,0);
    if (ch == '\n') break;
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string Connection::readLine() {
  string msg;  
  char ch;
  while (true) {
    recv(sock, &ch, 1, 0);
    if (ch == '\n')
      break;
    msg.push_back(ch);
  }
  return msg;
}